

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.c
# Opt level: O0

_Bool blogc_sysinfo_get_inside_docker(void)

{
  char *__haystack;
  char *pcVar1;
  _Bool inside_docker;
  char *contents;
  bc_error_t *err;
  size_t len;
  
  if (inside_docker_evaluated) {
    len._7_1_ = ::inside_docker;
  }
  else {
    inside_docker_evaluated = true;
    contents = (char *)0x0;
    __haystack = bc_file_get_contents
                           ("/proc/1/cgroup",false,(size_t *)&err,(bc_error_t **)&contents);
    if (contents == (char *)0x0) {
      pcVar1 = strstr(__haystack,"/docker/");
      free(__haystack);
      len._7_1_ = pcVar1 != (char *)0x0;
    }
    else {
      bc_error_free((bc_error_t *)contents);
      ::inside_docker = false;
      len._7_1_ = 0;
    }
  }
  return (_Bool)len._7_1_;
}

Assistant:

bool
blogc_sysinfo_get_inside_docker(void)
{
    if (inside_docker_evaluated)
        return inside_docker;
    inside_docker_evaluated = true;

    size_t len;
    bc_error_t *err = NULL;
    char *contents = bc_file_get_contents("/proc/1/cgroup", false, &len, &err);
    if (err != NULL) {
        bc_error_free(err);
        inside_docker = false;
        return inside_docker;
    }

    bool inside_docker = NULL != strstr(contents, "/docker/");
    free(contents);
    return inside_docker;
}